

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::operator+=(path *this,value_type x)

{
  size_type sVar1;
  
  sVar1 = (this->_path)._M_string_length;
  if ((sVar1 == 0) || ((this->_path)._M_dataplus._M_p[sVar1 - 1] != '/')) {
    std::__cxx11::string::push_back((char)this);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator+=(value_type x)
{
#ifdef GHC_OS_WINDOWS
    if (x == generic_separator) {
        x = preferred_separator;
    }
#endif
    if (_path.empty() || _path.back() != preferred_separator) {
        _path += x;
    }
    check_long_path();
    return *this;
}